

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O0

void search_and_patch_r(string *indent,uint8_t *cstart,uint8_t *cend,pattern_t *pattern)

{
  anon_class_8_1_a2015b58 __predicate;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  uchar *__first1;
  ostream *poVar4;
  size_type sVar5;
  uchar *puVar6;
  reference ppVar7;
  uchar *local_2a8;
  pattern_s local_238;
  string local_198;
  uchar *local_178;
  uint8_t *end;
  undefined1 local_160 [8];
  pattern_s child;
  iterator __end3;
  iterator __begin3;
  vector<pattern_s,_std::allocator<pattern_s>_> *__range3;
  uchar *found_1;
  bool patch;
  uint8_t *res;
  int found;
  anon_class_8_1_1b65d583 comparer2;
  anon_class_8_1_a2015b58 comparer;
  uint8_t replace_wildcard;
  uint8_t wildcard;
  pattern_t *pattern_local;
  uint8_t *cend_local;
  uint8_t *cstart_local;
  string *indent_local;
  
  comparer.wildcard._7_1_ = pattern->wildcard;
  comparer.wildcard._6_1_ = pattern->replace_wildcard;
  __predicate.wildcard = (uint8_t *)((long)&comparer.wildcard + 7);
  res._4_4_ = 0;
  cend_local = cstart;
  while( true ) {
    iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&pattern->patt);
    iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&pattern->patt);
    __first1 = std::
               search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                         (cend_local,cend,iVar2._M_current,iVar3._M_current,__predicate);
    if (cend <= __first1) break;
    res._4_4_ = res._4_4_ + 1;
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)indent);
    poVar4 = std::operator<<(poVar4,"Found <");
    poVar4 = std::operator<<(poVar4,(string *)pattern);
    poVar4 = std::operator<<(poVar4,"> at 0x");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)__first1 - (long)cend_local);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    found_1._7_1_ = 1;
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&pattern->validate);
    if (!bVar1) {
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pattern->validate);
      iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&pattern->validate);
      iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&pattern->validate);
      puVar6 = std::
               search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                         (__first1,__first1 + sVar5 + 5,iVar2._M_current,iVar3._M_current,
                          __predicate);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pattern->validate);
      if (__first1 + sVar5 + 5 <= puVar6) {
        found_1._7_1_ = force_invalid & 1;
      }
    }
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&pattern->replace);
    if (!bVar1) {
      if (found_1._7_1_ == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)indent);
        poVar4 = std::operator<<(poVar4,
                                 "Can\'t apply patch! (search region don\'t pass validation), use -force_invalid to force."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)indent);
        poVar4 = std::operator<<(poVar4,"Patching...");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&pattern->replace)
        ;
        iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&pattern->replace);
        std::
        transform<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,unsigned_char*,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__1>
                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )iVar2._M_current,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )iVar3._M_current,__first1 + pattern->replace_offset,
                   __first1 + pattern->replace_offset,(uint8_t *)((long)&comparer.wildcard + 6));
      }
    }
    bVar1 = std::vector<pattern_s,_std::allocator<pattern_s>_>::empty(&pattern->childs);
    if (!bVar1) {
      __end3 = std::vector<pattern_s,_std::allocator<pattern_s>_>::begin(&pattern->childs);
      child.childs.super__Vector_base<pattern_s,_std::allocator<pattern_s>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<pattern_s,_std::allocator<pattern_s>_>::end(&pattern->childs);
      while (bVar1 = __gnu_cxx::
                     operator==<pattern_s_*,_std::vector<pattern_s,_std::allocator<pattern_s>_>_>
                               (&__end3,(__normal_iterator<pattern_s_*,_std::vector<pattern_s,_std::allocator<pattern_s>_>_>
                                         *)&child.childs.
                                            super__Vector_base<pattern_s,_std::allocator<pattern_s>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar7 = __gnu_cxx::
                 __normal_iterator<pattern_s_*,_std::vector<pattern_s,_std::allocator<pattern_s>_>_>
                 ::operator*(&__end3);
        pattern_s::pattern_s((pattern_s *)local_160,ppVar7);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)indent);
        poVar4 = std::operator<<(poVar4,"Scanning SUB:<");
        poVar4 = std::operator<<(poVar4,(string *)local_160);
        poVar4 = std::operator<<(poVar4,">");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_2a8 = cend;
        if (child.validate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          local_2a8 = __first1 +
                      (long)child.validate.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        local_178 = local_2a8;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (indent,"...");
        std::__cxx11::string::string((string *)&local_198,indent);
        puVar6 = local_178;
        pattern_s::pattern_s(&local_238,(pattern_s *)local_160);
        search_and_patch_r(&local_198,__first1,puVar6,&local_238);
        pattern_s::~pattern_s(&local_238);
        std::__cxx11::string::~string((string *)&local_198);
        pattern_s::~pattern_s((pattern_s *)local_160);
        __gnu_cxx::
        __normal_iterator<pattern_s_*,_std::vector<pattern_s,_std::allocator<pattern_s>_>_>::
        operator++(&__end3);
      }
    }
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pattern->patt);
    cend_local = __first1 + sVar5;
  }
  if (res._4_4_ == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)indent);
    poVar4 = std::operator<<(poVar4,"Warning: <");
    poVar4 = std::operator<<(poVar4,(string *)pattern);
    poVar4 = std::operator<<(poVar4,"> was not found!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void search_and_patch_r(string indent, uint8_t* cstart, uint8_t* cend, pattern_t pattern)
{
    const uint8_t wildcard = pattern.wildcard;
    const uint8_t replace_wildcard = pattern.replace_wildcard;
    auto comparer = [&wildcard](uint8_t val1, uint8_t val2)
    {
        return (val1 == val2 || (wildcard && val2 == wildcard));
    };
    auto comparer2 = [&replace_wildcard](uint8_t val, uint8_t val2)
    {
        if (!replace_wildcard)
            return val;
        else if (val == replace_wildcard)
        {
            return val2;
        }

        return val;
    };
    int found = 0;
    for (;;)
    {
        uint8_t* res = std::search(cstart, cend, pattern.patt.begin(), pattern.patt.end(), comparer);
        if (res >= cend)
        {
            if(!found)
                std::cout << indent << "Warning: <" << pattern.name << "> was not found!" << std::endl;
            break;
        }
        found++;
        std::cout << indent << "Found <" << pattern.name << "> at 0x" << std::hex << (res-cstart) << std::endl;
        bool patch = true;
        if (!pattern.validate.empty())
        {
            auto found = std::search(res, res + pattern.validate.size() + 5, pattern.validate.begin(), pattern.validate.end(), comparer);
            if (found >= res + pattern.validate.size() + 5)
            {
                patch = force_invalid;
            }
        }
        if (!pattern.replace.empty())
        {
            if (patch)
            {
                std::cout << indent << "Patching..." << std::endl;
                std::transform(pattern.replace.begin(), pattern.replace.end(), res + pattern.replace_offset, res + pattern.replace_offset, comparer2);
            }
            else
            {
                std::cout << indent << "Can't apply patch! (search region don't pass validation), use -force_invalid to force." << std::endl;
            }
        }
        if (!pattern.childs.empty())
        {
            for (auto child : pattern.childs)
            {
                std::cout << indent << "Scanning SUB:<" << child.name << ">" << std::endl;
                auto end = child.max_search ? res + child.max_search : cend;
                indent += "...";
                search_and_patch_r(indent, res, end, child);
            }
        }
        cstart = res + pattern.patt.size();
    }
}